

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qfbcursor_p.cpp
# Opt level: O0

void QFbCursorDeviceListener::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QMetaType QVar1;
  undefined8 *in_RCX;
  int in_EDX;
  int in_ESI;
  QFbCursorDeviceListener *in_RDI;
  long in_FS_OFFSET;
  QFbCursorDeviceListener *_t;
  DeviceType in_stack_ffffffffffffffbc;
  QMetaType local_18;
  QMetaType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_ESI == 0) && (in_EDX == 0)) {
    onDeviceListChanged(in_RDI,in_stack_ffffffffffffffbc);
  }
  if (in_ESI == 7) {
    if (in_EDX == 0) {
      if (*(int *)in_RCX[1] == 0) {
        QVar1 = QMetaType::fromType<QInputDeviceManager::DeviceType>();
        *(QMetaTypeInterface **)*in_RCX = QVar1.d_ptr;
      }
      else {
        memset(&local_18,0,8);
        QMetaType::QMetaType(&local_18);
        *(QMetaTypeInterface **)*in_RCX = local_18.d_ptr;
      }
    }
    else {
      memset(&local_10,0,8);
      QMetaType::QMetaType(&local_10);
      *(QMetaTypeInterface **)*in_RCX = local_10.d_ptr;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFbCursorDeviceListener::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QFbCursorDeviceListener *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->onDeviceListChanged((*reinterpret_cast< std::add_pointer_t<QInputDeviceManager::DeviceType>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QInputDeviceManager::DeviceType >(); break;
            }
            break;
        }
    }
}